

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall RM_FileHandle::AllocateNewPage(RM_FileHandle *this,PF_PageHandle *ph,PageNum *page)

{
  int *piVar1;
  RC RVar2;
  RM_FileHandle *this_00;
  RM_PageHeader *pageheader;
  char *bitmap;
  RM_PageHeader *local_30;
  char *local_28;
  
  RVar2 = PF_FileHandle::AllocatePage(&this->pfh,ph);
  if (((RVar2 == 0) && (RVar2 = PF_PageHandle::GetPageNum(ph,page), RVar2 == 0)) &&
     (this_00 = this, RVar2 = GetPageDataAndBitmap(this,ph,&local_28,&local_30), RVar2 == 0)) {
    local_30->nextFreePage = (this->header).firstFreePage;
    local_30->numRecords = 0;
    ResetBitmap(this_00,local_28,(this->header).numRecordsPerPage);
    piVar1 = &(this->header).numPages;
    *piVar1 = *piVar1 + 1;
    (this->header).firstFreePage = *page;
  }
  return RVar2;
}

Assistant:

RC RM_FileHandle::AllocateNewPage(PF_PageHandle &ph, PageNum &page){
  RC rc;
  // allocate the page
  if((rc = pfh.AllocatePage(ph))){
    return (rc);
  }
  // get the page number of this allocated page
  if((rc = ph.GetPageNum(page)))
    return (rc);
 
  // create the page header
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    return (rc);
  pageheader->nextFreePage = header.firstFreePage;
  pageheader->numRecords = 0;
  if((rc = ResetBitmap(bitmap, header.numRecordsPerPage)))
    return (rc);

  header.numPages++; // update the file header to reflect addition of one
                     // more page
  // update the free pages linked list
  header.firstFreePage = page;
  return (0);
}